

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

string * disassemble_spirv_abi_cxx11_
                   (string *__return_storage_ptr__,VulkanDevice *device,VkPipeline pipeline,
                   DisasmMethod method,VkShaderStageFlagBits stage,
                   VkShaderModuleCreateInfo *module_create_info,char *entry_point)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  spvc_result sVar3;
  VkResult VVar4;
  ulong uVar5;
  void *pvVar6;
  pointer pVVar7;
  uint32_t *puVar8;
  pointer pVVar9;
  string *psVar10;
  pointer pVVar11;
  SpvExecutionModel model;
  iterator __begin4;
  pointer pVVar12;
  char *pcVar13;
  VkPipelineExecutableStatisticKHR *stat_1;
  pointer pVVar14;
  VkPipelineExecutableInternalRepresentationKHR *rep_2;
  uint32_t count;
  string str;
  char *output;
  pointer pVStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
  statistics;
  spvc_compiler comp;
  void *pvStack_80;
  undefined1 local_78 [8];
  spvc_compiler_options opts;
  pointer local_68;
  SpirvTools tools;
  
  if (method == ISA) {
    if (device->pipeline_stats == true) {
      count = 0;
      comp = (spvc_compiler)0x3b9ee4c9;
      pvStack_80 = (void *)0x0;
      local_78 = (undefined1  [8])pipeline;
      VVar4 = (*vkGetPipelineExecutablePropertiesKHR)
                        (device->device,(VkPipelineInfoKHR *)&comp,&count,
                         (VkPipelineExecutablePropertiesKHR *)0x0);
      if (VVar4 == VK_SUCCESS) {
        std::
        vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ::vector((vector<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                  *)&opts,(ulong)count,(allocator_type *)&str);
        for (pVVar7 = (pointer)opts; pVVar7 != local_68; pVVar7 = pVVar7 + 1) {
          *(undefined4 *)&((ScratchMemoryAllocation *)&pVVar7->sType)->_vptr_ScratchMemoryAllocation
               = 0x3b9ee4ca;
        }
        VVar4 = (*vkGetPipelineExecutablePropertiesKHR)
                          (device->device,(VkPipelineInfoKHR *)&comp,&count,
                           (VkPipelineExecutablePropertiesKHR *)opts);
        if (VVar4 == VK_SUCCESS) {
          puVar8 = &opts->backend_flags;
          uVar5 = 0;
LAB_0012bb0b:
          if (count != uVar5) {
            if ((*puVar8 & stage) == 0) goto code_r0x0012bb15;
            str._M_dataplus._M_p = (pointer)0x3b9ee4cb;
            str._M_string_length = 0;
            str.field_2._8_8_ = uVar5 & 0xffffffff;
            local_b8._M_allocated_capacity = 0;
            output = (char *)0x0;
            pVStack_c0 = (pointer)0x0;
            str.field_2._M_allocated_capacity = (size_type)pipeline;
            VVar4 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                              (device->device,(VkPipelineExecutableInfoKHR *)&str,&count,
                               (VkPipelineExecutableInternalRepresentationKHR *)0x0);
            if (VVar4 == VK_SUCCESS) {
              std::
              vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
              ::resize((vector<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                        *)&output,(ulong)count);
              for (pVVar9 = (pointer)output; pVVar9 != pVStack_c0; pVVar9 = pVVar9 + 1) {
                pVVar9->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
              }
              VVar4 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                                (device->device,(VkPipelineExecutableInfoKHR *)&str,&count,
                                 (VkPipelineExecutableInternalRepresentationKHR *)output);
              pVVar9 = pVStack_c0;
              pcVar13 = output;
              pVVar12 = (pointer)output;
              if (VVar4 == VK_SUCCESS) {
                for (; pVVar12 != pVVar9; pVVar12 = pVVar12 + 1) {
                  pvVar6 = malloc(pVVar12->dataSize);
                  pVVar12->pData = pvVar6;
                }
                VVar4 = (*vkGetPipelineExecutableInternalRepresentationsKHR)
                                  (device->device,(VkPipelineExecutableInfoKHR *)&str,&count,
                                   (VkPipelineExecutableInternalRepresentationKHR *)pcVar13);
                pVVar9 = pVStack_c0;
                pVVar12 = (pointer)output;
                if (VVar4 != VK_SUCCESS) {
                  for (; pVVar12 != pVVar9; pVVar12 = pVVar12 + 1) {
                    free(pVVar12->pData);
                  }
                  goto LAB_0012be23;
                }
              }
              else {
LAB_0012be23:
                if (pVStack_c0 != (pointer)output) {
                  pVStack_c0 = (pointer)output;
                }
              }
            }
            statistics.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            statistics.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            statistics.
            super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            VVar4 = (*vkGetPipelineExecutableStatisticsKHR)
                              (device->device,(VkPipelineExecutableInfoKHR *)&str,&count,
                               (VkPipelineExecutableStatisticKHR *)0x0);
            if (VVar4 == VK_SUCCESS) {
              std::
              vector<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
              ::resize(&statistics,(ulong)count);
              for (pVVar11 = statistics.
                             super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pVVar11 !=
                  statistics.
                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pVVar11 = pVVar11 + 1) {
                pVVar11->sType = VK_STRUCTURE_TYPE_PIPELINE_EXECUTABLE_INTERNAL_REPRESENTATION_KHR;
              }
              VVar4 = (*vkGetPipelineExecutableStatisticsKHR)
                                (device->device,(VkPipelineExecutableInfoKHR *)&str,&count,
                                 statistics.
                                 super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
              if ((VVar4 != VK_SUCCESS) &&
                 (statistics.
                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  statistics.
                  super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start)) {
                statistics.
                super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     statistics.
                     super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              }
            }
            pVVar9 = pVStack_c0;
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            __return_storage_ptr__->_M_string_length = 0;
            (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            for (pcVar13 = output + 0x110;
                pVVar11 = statistics.
                          super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                (pointer)(pcVar13 + -0x110) != pVVar9; pcVar13 = pcVar13 + 0x228) {
              if (*(int *)(pcVar13 + 0x100) != 0) {
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              free(*(void **)(pcVar13 + 0x110));
            }
            pVVar14 = statistics.
                      super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              if (pVVar14 == pVVar11) {
                std::
                _Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                ::~_Vector_base(&statistics.
                                 super__Vector_base<VkPipelineExecutableStatisticKHR,_std::allocator<VkPipelineExecutableStatisticKHR>_>
                               );
                std::
                _Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                ::~_Vector_base((_Vector_base<VkPipelineExecutableInternalRepresentationKHR,_std::allocator<VkPipelineExecutableInternalRepresentationKHR>_>
                                 *)&output);
                goto LAB_0012bb6a;
              }
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              switch(pVVar14->format) {
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_BOOL32_KHR:
                std::__cxx11::to_string((string *)&tools,(pVVar14->value).b32);
                break;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_INT64_KHR:
                std::__cxx11::to_string((string *)&tools,(pVVar14->value).i64);
                goto LAB_0012bfef;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_UINT64_KHR:
                std::__cxx11::to_string((string *)&tools,(pVVar14->value).u64);
LAB_0012bfef:
                std::__cxx11::string::append((string *)__return_storage_ptr__);
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                snprintf((char *)&tools,0x11,"%016llx",(pVVar14->value).i64);
LAB_0012c03f:
                std::__cxx11::string::append((char *)__return_storage_ptr__);
                goto LAB_0012c044;
              case VK_PIPELINE_EXECUTABLE_STATISTIC_FORMAT_FLOAT64_KHR:
                std::__cxx11::to_string((string *)&tools,(pVVar14->value).f64);
                break;
              default:
                goto LAB_0012c03f;
              }
              std::__cxx11::string::append((string *)__return_storage_ptr__);
              std::__cxx11::string::_M_dispose();
LAB_0012c044:
              std::__cxx11::string::append((char *)__return_storage_ptr__);
              pVVar14 = pVVar14 + 1;
            } while( true );
          }
          pcVar13 = "// Could not find stage in compiled pipeline.";
        }
        else {
          pcVar13 = "";
        }
        std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar13,(allocator *)&str);
LAB_0012bb6a:
        std::
        _Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
        ::~_Vector_base((_Vector_base<VkPipelineExecutablePropertiesKHR,_std::allocator<VkPipelineExecutablePropertiesKHR>_>
                         *)&opts);
        return __return_storage_ptr__;
      }
    }
    else if (device->amd_shader_info == true) {
      tools.impl_._M_t.
      super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
      .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl =
           (unique_ptr<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
           )(__uniq_ptr_data<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>,_true,_true>
             )0x0;
      VVar4 = (*vkGetShaderInfoAMD)
                        (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                         (size_t *)&tools,(void *)0x0);
      if (VVar4 == VK_SUCCESS) {
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)&str,
                   (size_type)
                   tools.impl_._M_t.
                   super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                   .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl,
                   (allocator_type *)&comp);
        VVar4 = (*vkGetShaderInfoAMD)
                          (device->device,pipeline,stage,VK_SHADER_INFO_TYPE_DISASSEMBLY_AMD,
                           (size_t *)&tools,str._M_dataplus._M_p);
        if (VVar4 == VK_SUCCESS) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((string *)__return_storage_ptr__,str._M_dataplus._M_p,str._M_string_length);
        }
        else {
          fwrite("Fossilize ERROR: Failed vkGetShaderInfoAMD.\n",0x2c,1,_stderr);
          fflush(_stderr);
          std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&comp);
        }
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  ((_Vector_base<char,_std::allocator<char>_> *)&str);
        return __return_storage_ptr__;
      }
      fwrite("Fossilize ERROR: Failed vkGetShaderInfoAMD.\n",0x2c,1,_stderr);
      fflush(_stderr);
    }
  }
  else {
    if (method == GLSL) {
      sVar3 = spvc_context_create((spvc_context *)&str);
      if (sVar3 != SPVC_SUCCESS) {
        pcVar13 = "// Failed";
        psVar10 = (string *)&tools;
        goto LAB_0012bd22;
      }
      sVar3 = spvc_context_parse_spirv
                        ((spvc_context)str._M_dataplus._M_p,module_create_info->pCode,
                         module_create_info->codeSize >> 2,(spvc_parsed_ir *)&tools);
      if (sVar3 != SPVC_SUCCESS) {
        spvc_context_destroy((spvc_context)str._M_dataplus._M_p);
        pcVar13 = "// Failed";
        psVar10 = (string *)&comp;
        goto LAB_0012bd22;
      }
      sVar3 = spvc_context_create_compiler
                        ((spvc_context)str._M_dataplus._M_p,SPVC_BACKEND_GLSL,
                         (spvc_parsed_ir)
                         tools.impl_._M_t.
                         super___uniq_ptr_impl<spvtools::SpirvTools::Impl,_std::default_delete<spvtools::SpirvTools::Impl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::SpirvTools::Impl_*,_std::default_delete<spvtools::SpirvTools::Impl>_>
                         .super__Head_base<0UL,_spvtools::SpirvTools::Impl_*,_false>._M_head_impl,
                         SPVC_CAPTURE_MODE_TAKE_OWNERSHIP,&comp);
      if (sVar3 != SPVC_SUCCESS) {
        spvc_context_destroy((spvc_context)str._M_dataplus._M_p);
        pcVar13 = "// Failed";
        psVar10 = (string *)&opts;
        goto LAB_0012bd22;
      }
      sVar3 = spvc_compiler_create_compiler_options(comp,&opts);
      if (sVar3 == SPVC_SUCCESS) {
        spvc_compiler_options_set_uint(opts,SPVC_COMPILER_OPTION_GLSL_VERSION,0x1cc);
        model = SpvExecutionModelVertex;
        spvc_compiler_options_set_bool(opts,SPVC_COMPILER_OPTION_GLSL_ES,'\0');
        spvc_compiler_options_set_bool(opts,SPVC_COMPILER_OPTION_GLSL_VULKAN_SEMANTICS,'\x01');
        spvc_compiler_install_compiler_options(comp,opts);
        if (entry_point != (char *)0x0) {
          switch(stage) {
          case VK_SHADER_STAGE_VERTEX_BIT:
            break;
          case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
            model = SpvExecutionModelTessellationControl;
            break;
          case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|VK_SHADER_STAGE_VERTEX_BIT:
          case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_VERTEX_BIT:
          case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
          case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT|
               VK_SHADER_STAGE_VERTEX_BIT:
            goto switchD_0012be0f_caseD_3;
          case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
            model = SpvExecutionModelTessellationEvaluation;
            break;
          case VK_SHADER_STAGE_GEOMETRY_BIT:
            model = SpvExecutionModelGeometry;
            break;
          default:
            if (stage == VK_SHADER_STAGE_CALLABLE_BIT_KHR) {
              model = SpvExecutionModelCallableKHR;
            }
            else if (stage == VK_SHADER_STAGE_COMPUTE_BIT) {
              model = SpvExecutionModelGLCompute;
            }
            else if (stage == VK_SHADER_STAGE_TASK_BIT_EXT) {
              model = SpvExecutionModelTaskEXT;
            }
            else if (stage == VK_SHADER_STAGE_MESH_BIT_EXT) {
              model = SpvExecutionModelMeshEXT;
            }
            else if (stage == VK_SHADER_STAGE_RAYGEN_BIT_KHR) {
              model = SpvExecutionModelRayGenerationKHR;
            }
            else if (stage == VK_SHADER_STAGE_ANY_HIT_BIT_KHR) {
              model = SpvExecutionModelAnyHitKHR;
            }
            else if (stage == VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR) {
              model = SpvExecutionModelClosestHitKHR;
            }
            else if (stage == VK_SHADER_STAGE_MISS_BIT_KHR) {
              model = SpvExecutionModelMissKHR;
            }
            else if (stage == VK_SHADER_STAGE_INTERSECTION_BIT_KHR) {
              model = SpvExecutionModelIntersectionKHR;
            }
            else {
              if (stage != VK_SHADER_STAGE_FRAGMENT_BIT) goto switchD_0012be0f_caseD_3;
              model = SpvExecutionModelFragment;
            }
          }
          spvc_compiler_set_entry_point(comp,entry_point,model);
        }
        sVar3 = spvc_compiler_compile(comp,&output);
        if (sVar3 == SPVC_SUCCESS) {
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,output,(allocator *)&statistics);
          spvc_context_destroy((spvc_context)str._M_dataplus._M_p);
          return __return_storage_ptr__;
        }
        spvc_context_destroy((spvc_context)str._M_dataplus._M_p);
        pcVar13 = "// Failed";
        psVar10 = (string *)&statistics;
      }
      else {
        spvc_context_destroy((spvc_context)str._M_dataplus._M_p);
switchD_0012be0f_caseD_3:
        pcVar13 = "// Failed";
        psVar10 = (string *)&output;
      }
      goto LAB_0012bd22;
    }
    if (method == Asm) {
      paVar1 = &str.field_2;
      str._M_string_length = 0;
      str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffffffffff00;
      str._M_dataplus._M_p = (pointer)paVar1;
      spvtools::SpirvTools::SpirvTools(&tools,SPV_ENV_VULKAN_1_2);
      bVar2 = spvtools::SpirvTools::Disassemble
                        (&tools,module_create_info->pCode,module_create_info->codeSize >> 2,&str,
                         0x40);
      if (bVar2) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p == paVar1) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               str.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = str.field_2._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = str._M_dataplus._M_p;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               str.field_2._M_allocated_capacity;
        }
        __return_storage_ptr__->_M_string_length = str._M_string_length;
        str._M_string_length = 0;
        str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffffffffff00;
        str._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&comp);
      }
      spvtools::SpirvTools::~SpirvTools(&tools);
      std::__cxx11::string::_M_dispose();
      return __return_storage_ptr__;
    }
  }
  pcVar13 = "";
  psVar10 = &str;
LAB_0012bd22:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar13,(allocator *)psVar10);
  return __return_storage_ptr__;
code_r0x0012bb15:
  uVar5 = uVar5 + 1;
  puVar8 = puVar8 + 0x86;
  goto LAB_0012bb0b;
}

Assistant:

static string disassemble_spirv(const VulkanDevice &device, VkPipeline pipeline,
                                DisasmMethod method, VkShaderStageFlagBits stage,
                                const VkShaderModuleCreateInfo *module_create_info, const char *entry_point)
{
	switch (method)
	{
	case DisasmMethod::Asm:
		return disassemble_spirv_asm(module_create_info);

	case DisasmMethod::GLSL:
		return disassemble_spirv_glsl(module_create_info, entry_point, stage);

	case DisasmMethod::ISA:
		return disassemble_spirv_isa(device, pipeline, stage);

	default:
		return "";
	}
}